

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O3

int varinfo_set_variant(varinfo *info,char *variant)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  int *piVar3;
  vardata_variant *pvVar4;
  ulong uVar5;
  vardata *pvVar6;
  long lVar7;
  ulong uVar8;
  int data;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar1 = symtab_get_t(info->data->symtab,variant,1,(int *)((long)&uStack_28 + 4));
  if (iVar1 == -1) {
    fprintf(_stderr,"no variant %s\n",variant);
  }
  else {
    pvVar6 = info->data;
    piVar3 = info->variants;
    pvVar4 = pvVar6->variants;
    iVar1 = pvVar4[uStack_28._4_4_].varset;
    if (piVar3[iVar1] == -1 || piVar3[iVar1] == uStack_28._4_4_) {
      uVar5 = (ulong)(uint)pvVar6->featuresnum;
      if (0 < pvVar6->featuresnum) {
        lVar7 = 0x18;
        uVar8 = 0;
        do {
          if ((info->fmask[uVar8 >> 5 & 0x7ffffff] >> ((uint)uVar8 & 0x1f) & 1) != 0) {
            iVar2 = mask_intersect(*(uint32_t **)((long)&pvVar6->features->name + lVar7),
                                   pvVar6->variants[uStack_28._4_4_].fmask,(int)uVar5);
            pvVar6 = info->data;
            if (iVar2 != -1) {
              varinfo_set_variant_cold_2();
              return -1;
            }
          }
          uVar8 = uVar8 + 1;
          uVar5 = (ulong)pvVar6->featuresnum;
          lVar7 = lVar7 + 0x40;
        } while ((long)uVar8 < (long)uVar5);
        piVar3 = info->variants;
        pvVar4 = pvVar6->variants;
      }
      piVar3[iVar1] = uStack_28._4_4_;
      mask_or(info->fmask,pvVar4[uStack_28._4_4_].fmask,pvVar6->featuresnum);
      return 0;
    }
    varinfo_set_variant_cold_1();
  }
  return -1;
}

Assistant:

int varinfo_set_variant(struct varinfo *info, const char *variant) {
	int data;
	if (symtab_get_t(info->data->symtab, variant, VARDATA_ST_VARIANT, &data) == -1) {
		fprintf(stderr, "no variant %s\n", variant);
		return -1;
	}
	int varset = info->data->variants[data].varset;
	if (info->variants[varset] != -1 && info->variants[varset] != data) {
		fprintf(stderr, "a variant from varset %s has already been selected\n", info->data->varsets[varset].name);
		return -1;
	}
	int i;
	for (i = 0; i < info->data->featuresnum; i++) {
		if (mask_get(info->fmask, i) && mask_intersect(info->data->features[i].cfmask, info->data->variants[data].fmask, info->data->featuresnum) != -1) {
			fprintf(stderr, "variant %s conflicts with feature %s\n", info->data->variants[data].name, info->data->features[i].name);
			return -1;
		}
	}
	info->variants[varset] = data;
	mask_or(info->fmask, info->data->variants[data].fmask, info->data->featuresnum);
	return 0;
}